

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QRhiDriverInfo *info)

{
  char *pcVar1;
  long in_RDX;
  undefined8 *puVar2;
  storage_type *psVar3;
  QTextStream *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)info);
  pQVar4 = (QTextStream *)(info->deviceName).d.d;
  pQVar4[0x30] = (QTextStream)0x0;
  QVar5.m_data = (storage_type *)0x1a;
  QVar5.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(pQVar4,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar4 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
  }
  puVar2 = *(undefined8 **)(in_RDX + 8);
  if (puVar2 == (undefined8 *)0x0) {
    puVar2 = &QByteArray::_empty;
  }
  QDebug::putByteArray((char *)info,(ulong)puVar2,(Latin1Content)*(undefined8 *)(in_RDX + 0x10));
  pQVar4 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
    pQVar4 = (QTextStream *)(info->deviceName).d.d;
  }
  QVar6.m_data = &DAT_0000000c;
  QVar6.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<(pQVar4,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar4 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
    pQVar4 = (QTextStream *)(info->deviceName).d.d;
  }
  Qt::hex(pQVar4);
  QTextStream::operator<<((QTextStream *)(info->deviceName).d.d,*(ulonglong *)(in_RDX + 0x18));
  pQVar4 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
    pQVar4 = (QTextStream *)(info->deviceName).d.d;
  }
  QVar7.m_data = &DAT_0000000c;
  QVar7.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<(pQVar4,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar4 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
    pQVar4 = (QTextStream *)(info->deviceName).d.d;
  }
  QTextStream::operator<<(pQVar4,*(ulonglong *)(in_RDX + 0x20));
  pQVar4 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
    pQVar4 = (QTextStream *)(info->deviceName).d.d;
  }
  QVar8.m_data = &DAT_0000000c;
  QVar8.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar4,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar4 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
  }
  pQVar4 = (QTextStream *)(info->deviceName).d.d;
  psVar3 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar1 = psVar3 + (long)((&PTR_anon_var_dwarf_4f5ac_007db538)[*(int *)(in_RDX + 0x28)] + 1);
    psVar3 = psVar3 + 1;
  } while (*pcVar1 != '\0');
  QVar9.m_data = psVar3;
  QVar9.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar4,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar4 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
    pQVar4 = (QTextStream *)(info->deviceName).d.d;
  }
  QTextStream::operator<<(pQVar4,')');
  pQVar4 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
    pQVar4 = (QTextStream *)(info->deviceName).d.d;
  }
  (info->deviceName).d.d = (Data *)0x0;
  *(QTextStream **)dbg.stream = pQVar4;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiDriverInfo &info)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiDriverInfo(deviceName=" << info.deviceName
                  << " deviceId=0x" << Qt::hex << info.deviceId
                  << " vendorId=0x" << info.vendorId
                  << " deviceType=" << deviceTypeStr(info.deviceType)
                  << ')';
    return dbg;
}